

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O1

bool __thiscall Assimp::DeboneProcess::ConsiderMesh(DeboneProcess *this,aiMesh *pMesh)

{
  float fVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  void *pvVar5;
  aiBone *paVar6;
  ulong uVar7;
  Logger *this_00;
  ulong uVar8;
  undefined4 uVar9;
  aiFace *paVar10;
  ulong uVar11;
  ulong uVar12;
  bool bVar13;
  ulong uVar14;
  vector<bool,_std::allocator<bool>_> isBoneNecessary;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertexBones;
  allocator_type local_89;
  DeboneProcess *local_88;
  vector<bool,_std::allocator<bool>_> local_80;
  float local_58;
  value_type_conflict4 local_54;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  ulong local_38;
  
  if (pMesh->mNumBones == 0 || pMesh->mBones == (aiBone **)0x0) {
    bVar13 = false;
  }
  else {
    local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start._0_1_ = 0;
    local_88 = this;
    std::vector<bool,_std::allocator<bool>_>::vector
              (&local_80,(ulong)pMesh->mNumBones,(bool *)&local_50,(allocator_type *)&local_54);
    local_54 = 0xffffffff;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_50,(ulong)pMesh->mNumVertices,&local_54,&local_89);
    if (pMesh->mNumBones != 0) {
      uVar14 = 0;
      bVar13 = false;
      do {
        paVar6 = pMesh->mBones[uVar14];
        if (paVar6->mNumWeights != 0) {
          uVar11 = 1L << ((byte)uVar14 & 0x3f);
          bVar4 = (byte)uVar14 & 0x3f;
          local_38 = -2L << bVar4 | 0xfffffffffffffffeU >> 0x40 - bVar4;
          uVar12 = 0;
          do {
            fVar1 = paVar6->mWeights[uVar12].mWeight;
            if ((fVar1 != 0.0) || (NAN(fVar1))) {
              local_58 = fVar1;
              if (local_88->mThreshold <= fVar1) {
                uVar7 = (ulong)paVar6->mWeights[uVar12].mVertexId;
                uVar8 = (ulong)*(uint *)(CONCAT71(local_50.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                  local_50.
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                        uVar7 * 4);
                uVar9 = (undefined4)uVar14;
                if ((uVar8 == 0xffffffff) || (uVar9 = 0xfffffffe, uVar14 != uVar8)) {
                  *(undefined4 *)
                   (CONCAT71(local_50.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._1_7_,
                             local_50.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._0_1_) + uVar7 * 4) = uVar9;
                }
                else {
                  this_00 = DefaultLogger::get();
                  Logger::warn(this_00,"Encountered double entry in bone weights");
                }
              }
              uVar7 = local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6];
              if ((uVar7 & uVar11) == 0) {
                uVar8 = uVar7 | uVar11;
                if (local_88->mThreshold <= local_58) {
                  uVar8 = uVar7 & local_38;
                }
                local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                ._M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] = uVar8;
              }
            }
            uVar12 = uVar12 + 1;
            paVar6 = pMesh->mBones[uVar14];
          } while (uVar12 < paVar6->mNumWeights);
        }
        if ((local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
          bVar13 = true;
        }
        uVar14 = uVar14 + 1;
      } while (uVar14 < pMesh->mNumBones);
      if ((bVar13) && (pMesh->mNumFaces != 0)) {
        uVar14 = 0;
        do {
          paVar10 = pMesh->mFaces;
          if (1 < paVar10[uVar14].mNumIndices) {
            uVar2 = *(uint *)(CONCAT71(local_50.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                       local_50.
                                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                       ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                             (ulong)*paVar10[uVar14].mIndices * 4);
            uVar11 = 1;
            do {
              uVar3 = *(uint *)(CONCAT71(local_50.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                         local_50.
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                               (ulong)paVar10[uVar14].mIndices[uVar11] * 4);
              if (uVar2 != uVar3) {
                if (uVar2 < pMesh->mNumBones) {
                  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] =
                       local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar2 >> 6] |
                       1L << ((byte)uVar2 & 0x3f);
                }
                if (uVar3 < pMesh->mNumBones) {
                  local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar3 >> 6] =
                       local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                       super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar3 >> 6] |
                       1L << ((byte)uVar3 & 0x3f);
                }
              }
              uVar11 = uVar11 + 1;
              paVar10 = pMesh->mFaces;
            } while (uVar11 < paVar10[uVar14].mNumIndices);
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < pMesh->mNumFaces);
      }
    }
    if (pMesh->mNumBones == 0) {
      bVar13 = false;
    }
    else {
      uVar14 = 0;
      bVar13 = false;
      do {
        if ((local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar14 >> 6] >> (uVar14 & 0x3f) & 1) == 0) {
          local_88->mNumBonesCanDoWithout = local_88->mNumBonesCanDoWithout + 1;
          bVar13 = true;
        }
        local_88->mNumBones = local_88->mNumBones + 1;
        uVar14 = uVar14 + 1;
      } while (uVar14 < pMesh->mNumBones);
    }
    pvVar5 = (void *)CONCAT71(local_50.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_50.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start._0_1_);
    if (pvVar5 != (void *)0x0) {
      operator_delete(pvVar5,(long)local_50.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar5)
      ;
    }
    if (local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
      operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                      (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_end_of_storage -
                      (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                            super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
    }
  }
  return bVar13;
}

Assistant:

bool DeboneProcess::ConsiderMesh(const aiMesh* pMesh)
{
    if(!pMesh->HasBones()) {
        return false;
    }

    bool split = false;

    //interstitial faces not permitted
    bool isInterstitialRequired = false;

    std::vector<bool> isBoneNecessary(pMesh->mNumBones,false);
    std::vector<unsigned int> vertexBones(pMesh->mNumVertices,UINT_MAX);

    const unsigned int cUnowned = UINT_MAX;
    const unsigned int cCoowned = UINT_MAX-1;

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        for(unsigned int j=0;j<pMesh->mBones[i]->mNumWeights;j++)   {
            float w = pMesh->mBones[i]->mWeights[j].mWeight;

            if(w==0.0f) {
                continue;
            }

            unsigned int vid = pMesh->mBones[i]->mWeights[j].mVertexId;
            if(w>=mThreshold)   {

                if(vertexBones[vid]!=cUnowned)  {
                    if(vertexBones[vid]==i) //double entry
                    {
                        ASSIMP_LOG_WARN("Encountered double entry in bone weights");
                    }
                    else //TODO: track attraction in order to break tie
                    {
                        vertexBones[vid] = cCoowned;
                    }
                }
                else vertexBones[vid] = i;
            }

            if(!isBoneNecessary[i]) {
                isBoneNecessary[i] = w<mThreshold;
            }
        }

        if(!isBoneNecessary[i])  {
            isInterstitialRequired = true;
        }
    }

    if(isInterstitialRequired) {
        for(unsigned int i=0;i<pMesh->mNumFaces;i++) {
            unsigned int v = vertexBones[pMesh->mFaces[i].mIndices[0]];

            for(unsigned int j=1;j<pMesh->mFaces[i].mNumIndices;j++) {
                unsigned int w = vertexBones[pMesh->mFaces[i].mIndices[j]];

                if(v!=w)    {
                    if(v<pMesh->mNumBones) isBoneNecessary[v] = true;
                    if(w<pMesh->mNumBones) isBoneNecessary[w] = true;
                }
            }
        }
    }

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        if(!isBoneNecessary[i]) {
            mNumBonesCanDoWithout++;
            split = true;
        }

        mNumBones++;
    }
    return split;
}